

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitHeaderGenerator
          (InstructionDisassembler *this,uint32_t generator)

{
  int iVar1;
  char *__s2;
  ostream *poVar2;
  
  __s2 = spvGeneratorStr(generator >> 0x10);
  poVar2 = std::operator<<(this->stream_,"; Generator: ");
  std::operator<<(poVar2,__s2);
  iVar1 = strcmp("Unknown",__s2);
  if (iVar1 == 0) {
    poVar2 = std::operator<<(this->stream_,"(");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<(this->stream_,"; ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void InstructionDisassembler::EmitHeaderGenerator(uint32_t generator) {
  const char* generator_tool =
      spvGeneratorStr(SPV_GENERATOR_TOOL_PART(generator));
  stream_ << "; Generator: " << generator_tool;
  // For unknown tools, print the numeric tool value.
  if (0 == strcmp("Unknown", generator_tool)) {
    stream_ << "(" << SPV_GENERATOR_TOOL_PART(generator) << ")";
  }
  // Print the miscellaneous part of the generator word on the same
  // line as the tool name.
  stream_ << "; " << SPV_GENERATOR_MISC_PART(generator) << "\n";
}